

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckFailsOnFalse::~TestCheckFailsOnFalse(TestCheckFailsOnFalse *this)

{
  TestCheckFailsOnFalse *this_local;
  
  ~TestCheckFailsOnFalse(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckFailsOnFalse)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK(false);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}